

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int get_crazy_fail(int test)

{
  undefined4 local_10;
  int fail;
  int test_local;
  
  local_10 = 1;
  if ((((((test == 0x2c) ||
         ((((0x31 < test && (test < 0x38)) || (test == 0x4f)) || ((0x54 < test && (test < 0x5b))))))
        || ((test == 0x9a || (((0x9f < test && (test < 0xa6)) || ((0xb1 < test && (test < 0xb6))))))
           )) || ((((test == 0xb7 || (test == 0xbd)) || (test == 0xbf)) ||
                  ((0xc2 < test && (test < 0xc9)))))) || ((0xca < test && (test < 0xcf)))) ||
     ((((test == 0xd7 || (test == 0xd8)) || ((test == 0xdb || (test == 0xe7)))) ||
      ((0xec < test && (test < 0xf3)))))) {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

static int get_crazy_fail(int test) {
    /*
     * adding 1000000 of character 'a' leads to parser failure mostly
     * everywhere except in those special spots. Need to be updated
     * each time crazy is updated
     */
    int fail = 1;
    if ((test == 44) || /* PI in Misc */
        ((test >= 50) && (test <= 55)) || /* Comment in Misc */
        (test == 79) || /* PI in DTD */
        ((test >= 85) && (test <= 90)) || /* Comment in DTD */
        (test == 154) || /* PI in Misc */
        ((test >= 160) && (test <= 165)) || /* Comment in Misc */
        ((test >= 178) && (test <= 181)) || /* attribute value */
        (test == 183) || /* Text */
        (test == 189) || /* PI in Content */
        (test == 191) || /* Text */
        ((test >= 195) && (test <= 200)) || /* Comment in Content */
        ((test >= 203) && (test <= 206)) || /* Text */
        (test == 215) || (test == 216) || /* in CDATA */
        (test == 219) || /* Text */
        (test == 231) || /* PI in Misc */
        ((test >= 237) && (test <= 242))) /* Comment in Misc */
        fail = 0;
    return(fail);
}